

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

vector<RPCArg,_std::allocator<RPCArg>_> * CreateTxDoc(void)

{
  string name;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  string name_05;
  string name_06;
  string name_07;
  string name_08;
  string name_09;
  string name_10;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  RPCArgOptions opts_03;
  RPCArgOptions opts_04;
  RPCArgOptions opts_05;
  RPCArgOptions opts_06;
  RPCArgOptions opts_07;
  RPCArgOptions opts_08;
  RPCArgOptions opts_09;
  RPCArgOptions opts_10;
  long lVar1;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCArg> __l_03;
  initializer_list<RPCArg> __l_04;
  undefined8 in_stack_ffffffffffffe6e8;
  RPCArgOptions *pRVar2;
  undefined1 in_stack_ffffffffffffe6f0 [17];
  bool in_stack_ffffffffffffe701;
  bool bVar3;
  undefined2 in_stack_ffffffffffffe702;
  int in_stack_ffffffffffffe704;
  int iVar4;
  _Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
  in_stack_ffffffffffffe708;
  string in_stack_ffffffffffffe768;
  _Vector_impl_data in_stack_ffffffffffffe788;
  undefined1 in_stack_ffffffffffffe7a0 [24];
  bool in_stack_ffffffffffffe7b8;
  undefined7 in_stack_ffffffffffffe7b9;
  _Alloc_hider in_stack_ffffffffffffe7c0;
  size_type in_stack_ffffffffffffe7c8;
  undefined1 in_stack_ffffffffffffe7d0;
  undefined1 in_stack_ffffffffffffe7d1 [15];
  pointer in_stack_ffffffffffffe7e0;
  string local_1800 [32];
  UniValue local_17e0;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1788;
  string local_1728 [32];
  RPCArgOptions local_1708;
  string local_16c0 [32];
  UniValue local_16a0;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1648;
  string local_15e8 [32];
  RPCArgOptions local_15c8;
  RPCArgOptions local_1580;
  RPCArgOptions local_1538;
  string local_14f0 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_14d0;
  undefined1 local_1478;
  string local_1470 [32];
  RPCArg local_1450;
  string local_1348 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1328;
  undefined1 local_12d0;
  string local_12c8 [32];
  RPCArgOptions local_12a8;
  RPCArgOptions local_1260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1218;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_11f8;
  undefined1 local_11a0;
  string local_1198 [32];
  RPCArg local_1178;
  string local_1070 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1050;
  undefined1 local_ff8;
  string local_ff0 [32];
  RPCArg local_fd0 [2];
  string local_dc0 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_da0;
  undefined1 local_d48;
  string local_d40 [32];
  RPCArgOptions local_d20;
  RPCArgOptions local_cd8;
  RPCArgOptions local_c90;
  string local_c48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_c08;
  string local_ba8 [32];
  RPCArgOptions local_b88;
  string local_b40 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_b20;
  undefined1 local_ac8;
  string local_ac0 [32];
  RPCArgOptions local_aa0;
  string local_a58 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_a38;
  undefined1 local_9e0;
  string local_9d8 [32];
  RPCArg local_9b8 [3];
  string local_6a0 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_680;
  undefined1 local_628;
  string local_620 [32];
  RPCArg local_600;
  string local_4f8 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4d8;
  undefined1 local_480;
  string local_478 [32];
  RPCArg local_458 [4];
  long local_38;
  
  local_1050._32_8_ = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_478,"inputs",(allocator<char> *)&stack0xffffffffffffe7b7);
  local_4d8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_480 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_4f8,"The inputs",(allocator<char> *)&stack0xffffffffffffe7b6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_620,"",(allocator<char> *)&stack0xffffffffffffe797);
  local_680._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_628 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_6a0,"",(allocator<char> *)&stack0xffffffffffffe796);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9d8,"txid",(allocator<char> *)&stack0xffffffffffffe777);
  local_a38._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_9e0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_a58,"The transaction id",(allocator<char> *)&stack0xffffffffffffe776);
  local_aa0.oneline_description._M_dataplus._M_p = (pointer)&local_aa0.oneline_description.field_2;
  local_aa0.skip_type_check = false;
  local_aa0.oneline_description._M_string_length = 0;
  local_aa0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_aa0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_aa0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_aa0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_aa0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_aa0._58_8_ = 0;
  name._8_17_ = in_stack_ffffffffffffe6f0;
  name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe6e8;
  name.field_2._M_local_buf[9] = in_stack_ffffffffffffe701;
  name.field_2._10_2_ = in_stack_ffffffffffffe702;
  name.field_2._12_4_ = in_stack_ffffffffffffe704;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7a0._0_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7a0._16_8_;
  opts._0_24_ = in_stack_ffffffffffffe788;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = in_stack_ffffffffffffe7b8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = in_stack_ffffffffffffe7b9;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe7c0._M_p;
  opts.hidden = (bool)(char)in_stack_ffffffffffffe7c8;
  opts.also_positional = (bool)(char)(in_stack_ffffffffffffe7c8 >> 8);
  opts._66_6_ = (int6)(in_stack_ffffffffffffe7c8 >> 0x10);
  RPCArg::RPCArg(local_9b8,name,(Type)local_9d8,(Fallback)in_stack_ffffffffffffe708,
                 in_stack_ffffffffffffe768,opts);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ac0,"vout",(allocator<char> *)&stack0xffffffffffffe775);
  local_b20._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_ac8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_b40,"The output number",(allocator<char> *)&stack0xffffffffffffe774);
  local_b88.oneline_description._M_dataplus._M_p = (pointer)&local_b88.oneline_description.field_2;
  local_b88.skip_type_check = false;
  local_b88.oneline_description._M_string_length = 0;
  local_b88.oneline_description.field_2._M_local_buf[0] = '\0';
  local_b88.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b88.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_b88.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_b88.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_b88._58_8_ = 0;
  name_00._8_17_ = in_stack_ffffffffffffe6f0;
  name_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe6e8;
  name_00.field_2._M_local_buf[9] = in_stack_ffffffffffffe701;
  name_00.field_2._10_2_ = in_stack_ffffffffffffe702;
  name_00.field_2._12_4_ = in_stack_ffffffffffffe704;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7a0._0_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7a0._16_8_;
  opts_00._0_24_ = in_stack_ffffffffffffe788;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = in_stack_ffffffffffffe7b8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = in_stack_ffffffffffffe7b9;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe7c0._M_p;
  opts_00.hidden = (bool)(char)in_stack_ffffffffffffe7c8;
  opts_00.also_positional = (bool)(char)(in_stack_ffffffffffffe7c8 >> 8);
  opts_00._66_6_ = (int6)(in_stack_ffffffffffffe7c8 >> 0x10);
  RPCArg::RPCArg(local_9b8 + 1,name_00,(Type)local_ac0,(Fallback)in_stack_ffffffffffffe708,
                 in_stack_ffffffffffffe768,opts_00);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ba8,"sequence",(allocator<char> *)&stack0xffffffffffffe773);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c28,
             "depends on the value of the \'replaceable\' and \'locktime\' arguments",
             (allocator<char> *)&stack0xffffffffffffe772);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_c08,&local_c28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c48,"The sequence number",(allocator<char> *)&stack0xffffffffffffe771);
  local_c90.oneline_description._M_dataplus._M_p = (pointer)&local_c90.oneline_description.field_2;
  local_c90.skip_type_check = false;
  local_c90.oneline_description._M_string_length = 0;
  local_c90.oneline_description.field_2._M_local_buf[0] = '\0';
  local_c90.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c90.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_c90.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_c90.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_c90._58_8_ = 0;
  name_01._8_17_ = in_stack_ffffffffffffe6f0;
  name_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe6e8;
  name_01.field_2._M_local_buf[9] = in_stack_ffffffffffffe701;
  name_01.field_2._10_2_ = in_stack_ffffffffffffe702;
  name_01.field_2._12_4_ = in_stack_ffffffffffffe704;
  opts_01.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7a0._0_16_;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7a0._16_8_;
  opts_01._0_24_ = in_stack_ffffffffffffe788;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = in_stack_ffffffffffffe7b8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = in_stack_ffffffffffffe7b9;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe7c0._M_p;
  opts_01.hidden = (bool)(char)in_stack_ffffffffffffe7c8;
  opts_01.also_positional = (bool)(char)(in_stack_ffffffffffffe7c8 >> 8);
  opts_01._66_6_ = (int6)(in_stack_ffffffffffffe7c8 >> 0x10);
  RPCArg::RPCArg(local_9b8 + 2,name_01,(Type)local_ba8,(Fallback)in_stack_ffffffffffffe708,
                 in_stack_ffffffffffffe768,opts_01);
  __l._M_len = 3;
  __l._M_array = local_9b8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe778,__l,
             (allocator_type *)&stack0xffffffffffffe770);
  local_cd8.oneline_description._M_dataplus._M_p = (pointer)&local_cd8.oneline_description.field_2;
  local_cd8.skip_type_check = false;
  local_cd8.oneline_description._M_string_length = 0;
  local_cd8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_cd8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_cd8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_cd8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_cd8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_cd8._58_8_ = 0;
  name_02._8_17_ = in_stack_ffffffffffffe6f0;
  name_02._M_dataplus._M_p = &local_cd8.skip_type_check;
  name_02.field_2._M_local_buf[9] = in_stack_ffffffffffffe701;
  name_02.field_2._10_2_ = in_stack_ffffffffffffe702;
  name_02.field_2._12_4_ = in_stack_ffffffffffffe704;
  opts_06.oneline_description.field_2._M_local_buf[0] = in_stack_ffffffffffffe7b8;
  opts_06.skip_type_check = (bool)in_stack_ffffffffffffe7a0[0];
  opts_06._1_7_ = in_stack_ffffffffffffe7a0._1_7_;
  opts_06.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a0._8_8_;
  opts_06.oneline_description._M_string_length = in_stack_ffffffffffffe7a0._16_8_;
  opts_06.oneline_description.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffe7b9;
  opts_06.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7c0._M_p;
  opts_06.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7c8;
  opts_06.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = in_stack_ffffffffffffe7d0;
  opts_06.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._9_15_ = in_stack_ffffffffffffe7d1;
  opts_06._64_8_ = in_stack_ffffffffffffe7e0;
  RPCArg::RPCArg(&local_600,name_02,(Type)local_620,(Fallback)in_stack_ffffffffffffe708,
                 in_stack_ffffffffffffe768,
                 (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_ffffffffffffe788,opts_06);
  __l_00._M_len = 1;
  __l_00._M_array = &local_600;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe798,__l_00,
             (allocator_type *)&stack0xffffffffffffe76f);
  local_d20.oneline_description._M_dataplus._M_p = (pointer)&local_d20.oneline_description.field_2;
  local_d20.skip_type_check = false;
  local_d20.oneline_description._M_string_length = 0;
  local_d20.oneline_description.field_2._M_local_buf[0] = '\0';
  local_d20.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d20.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_d20.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_d20.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_d20._58_8_ = 0;
  pRVar2 = &local_d20;
  name_03._8_17_ = in_stack_ffffffffffffe6f0;
  name_03._M_dataplus._M_p = &pRVar2->skip_type_check;
  name_03.field_2._M_local_buf[9] = in_stack_ffffffffffffe701;
  name_03.field_2._10_2_ = in_stack_ffffffffffffe702;
  name_03.field_2._12_4_ = in_stack_ffffffffffffe704;
  opts_07.oneline_description.field_2._M_local_buf[0] = in_stack_ffffffffffffe7b8;
  opts_07.skip_type_check = (bool)in_stack_ffffffffffffe7a0[0];
  opts_07._1_7_ = in_stack_ffffffffffffe7a0._1_7_;
  opts_07.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a0._8_8_;
  opts_07.oneline_description._M_string_length = in_stack_ffffffffffffe7a0._16_8_;
  opts_07.oneline_description.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffe7b9;
  opts_07.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7c0._M_p;
  opts_07.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7c8;
  opts_07.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = in_stack_ffffffffffffe7d0;
  opts_07.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._9_15_ = in_stack_ffffffffffffe7d1;
  opts_07._64_8_ = in_stack_ffffffffffffe7e0;
  RPCArg::RPCArg(local_458,name_03,(Type)local_478,(Fallback)in_stack_ffffffffffffe708,
                 in_stack_ffffffffffffe768,
                 (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_ffffffffffffe788,opts_07);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d40,"outputs",(allocator<char> *)&stack0xffffffffffffe76e);
  local_da0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_d48 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_dc0,
             "The outputs specified as key-value pairs.\nEach key may only appear once, i.e. there can only be one \'data\' output, and no address may be duplicated.\nAt least one output of either type must be specified.\nFor compatibility reasons, a dictionary, which holds the key-value pairs directly, is also\n                             accepted as second parameter."
             ,(allocator<char> *)&stack0xffffffffffffe76d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ff0,"",(allocator<char> *)&stack0xffffffffffffe74f);
  local_1050._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_ff8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1070,"",(allocator<char> *)&stack0xffffffffffffe74e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1198,"address",(allocator<char> *)&stack0xffffffffffffe72f);
  local_11f8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_11a0 = 0;
  std::operator+(&local_1218,
                 "A key-value pair. The key (string) is the bitcoin address, the value (float or string) is the amount in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  local_1260.oneline_description._M_dataplus._M_p = (pointer)&local_1260.oneline_description.field_2
  ;
  local_1260.skip_type_check = false;
  local_1260.oneline_description._M_string_length = 0;
  local_1260.oneline_description.field_2._M_local_buf[0] = '\0';
  local_1260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_1260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_1260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_1260._58_8_ = 0;
  name_04._8_17_ = in_stack_ffffffffffffe6f0;
  name_04._M_dataplus._M_p = &pRVar2->skip_type_check;
  name_04.field_2._M_local_buf[9] = in_stack_ffffffffffffe701;
  name_04.field_2._10_2_ = in_stack_ffffffffffffe702;
  name_04.field_2._12_4_ = in_stack_ffffffffffffe704;
  opts_02.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7a0._0_16_;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7a0._16_8_;
  opts_02._0_24_ = in_stack_ffffffffffffe788;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = in_stack_ffffffffffffe7b8;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = in_stack_ffffffffffffe7b9;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe7c0._M_p;
  opts_02.hidden = (bool)(char)in_stack_ffffffffffffe7c8;
  opts_02.also_positional = (bool)(char)(in_stack_ffffffffffffe7c8 >> 8);
  opts_02._66_6_ = (int6)(in_stack_ffffffffffffe7c8 >> 0x10);
  RPCArg::RPCArg(&local_1178,name_04,(Type)local_1198,(Fallback)in_stack_ffffffffffffe708,
                 in_stack_ffffffffffffe768,opts_02);
  __l_01._M_len = 1;
  __l_01._M_array = &local_1178;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe730,__l_01,
             (allocator_type *)&stack0xffffffffffffe72e);
  local_12a8.oneline_description._M_dataplus._M_p = (pointer)&local_12a8.oneline_description.field_2
  ;
  local_12a8.skip_type_check = false;
  local_12a8.oneline_description._M_string_length = 0;
  local_12a8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_12a8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12a8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_12a8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_12a8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_12a8._58_8_ = 0;
  pRVar2 = &local_12a8;
  name_05._8_17_ = in_stack_ffffffffffffe6f0;
  name_05._M_dataplus._M_p = &pRVar2->skip_type_check;
  name_05.field_2._M_local_buf[9] = in_stack_ffffffffffffe701;
  name_05.field_2._10_2_ = in_stack_ffffffffffffe702;
  name_05.field_2._12_4_ = in_stack_ffffffffffffe704;
  opts_08.oneline_description.field_2._M_local_buf[0] = in_stack_ffffffffffffe7b8;
  opts_08.skip_type_check = (bool)in_stack_ffffffffffffe7a0[0];
  opts_08._1_7_ = in_stack_ffffffffffffe7a0._1_7_;
  opts_08.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a0._8_8_;
  opts_08.oneline_description._M_string_length = in_stack_ffffffffffffe7a0._16_8_;
  opts_08.oneline_description.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffe7b9;
  opts_08.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7c0._M_p;
  opts_08.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7c8;
  opts_08.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = in_stack_ffffffffffffe7d0;
  opts_08.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._9_15_ = in_stack_ffffffffffffe7d1;
  opts_08._64_8_ = in_stack_ffffffffffffe7e0;
  RPCArg::RPCArg(local_fd0,name_05,(Type)local_ff0,(Fallback)in_stack_ffffffffffffe708,
                 in_stack_ffffffffffffe768,
                 (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_ffffffffffffe788,opts_08);
  std::__cxx11::string::string<std::allocator<char>>
            (local_12c8,"",(allocator<char> *)&stack0xffffffffffffe72d);
  local_1328._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_12d0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1348,"",(allocator<char> *)&stack0xffffffffffffe72c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1470,"data",(allocator<char> *)&stack0xffffffffffffe70f);
  local_14d0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1478 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_14f0,"A key-value pair. The key must be \"data\", the value is hex-encoded data",
             (allocator<char> *)&stack0xffffffffffffe70e);
  local_1538.oneline_description._M_dataplus._M_p = (pointer)&local_1538.oneline_description.field_2
  ;
  local_1538.skip_type_check = false;
  local_1538.oneline_description._M_string_length = 0;
  local_1538.oneline_description.field_2._M_local_buf[0] = '\0';
  local_1538.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1538.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_1538.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_1538.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_1538._58_8_ = 0;
  name_06._8_17_ = in_stack_ffffffffffffe6f0;
  name_06._M_dataplus._M_p = &pRVar2->skip_type_check;
  name_06.field_2._M_local_buf[9] = in_stack_ffffffffffffe701;
  name_06.field_2._10_2_ = in_stack_ffffffffffffe702;
  name_06.field_2._12_4_ = in_stack_ffffffffffffe704;
  opts_03.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7a0._0_16_;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7a0._16_8_;
  opts_03._0_24_ = in_stack_ffffffffffffe788;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = in_stack_ffffffffffffe7b8;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = in_stack_ffffffffffffe7b9;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe7c0._M_p;
  opts_03.hidden = (bool)(char)in_stack_ffffffffffffe7c8;
  opts_03.also_positional = (bool)(char)(in_stack_ffffffffffffe7c8 >> 8);
  opts_03._66_6_ = (int6)(in_stack_ffffffffffffe7c8 >> 0x10);
  RPCArg::RPCArg(&local_1450,name_06,(Type)local_1470,(Fallback)in_stack_ffffffffffffe708,
                 in_stack_ffffffffffffe768,opts_03);
  __l_02._M_len = 1;
  __l_02._M_array = &local_1450;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe710,__l_02,
             (allocator_type *)&stack0xffffffffffffe70d);
  local_1580.oneline_description._M_dataplus._M_p = (pointer)&local_1580.oneline_description.field_2
  ;
  local_1580.skip_type_check = false;
  local_1580.oneline_description._M_string_length = 0;
  local_1580.oneline_description.field_2._M_local_buf[0] = '\0';
  local_1580.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1580.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_1580.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_1580.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_1580._58_8_ = 0;
  name_07._8_17_ = in_stack_ffffffffffffe6f0;
  name_07._M_dataplus._M_p = &local_1580.skip_type_check;
  name_07.field_2._M_local_buf[9] = in_stack_ffffffffffffe701;
  name_07.field_2._10_2_ = in_stack_ffffffffffffe702;
  name_07.field_2._12_4_ = in_stack_ffffffffffffe704;
  opts_09.oneline_description.field_2._M_local_buf[0] = in_stack_ffffffffffffe7b8;
  opts_09.skip_type_check = (bool)in_stack_ffffffffffffe7a0[0];
  opts_09._1_7_ = in_stack_ffffffffffffe7a0._1_7_;
  opts_09.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a0._8_8_;
  opts_09.oneline_description._M_string_length = in_stack_ffffffffffffe7a0._16_8_;
  opts_09.oneline_description.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffe7b9;
  opts_09.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7c0._M_p;
  opts_09.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7c8;
  opts_09.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = in_stack_ffffffffffffe7d0;
  opts_09.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._9_15_ = in_stack_ffffffffffffe7d1;
  opts_09._64_8_ = in_stack_ffffffffffffe7e0;
  RPCArg::RPCArg(local_fd0 + 1,name_07,(Type)local_12c8,(Fallback)in_stack_ffffffffffffe708,
                 in_stack_ffffffffffffe768,
                 (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_ffffffffffffe788,opts_09);
  __l_03._M_len = 2;
  __l_03._M_array = local_fd0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe750,__l_03,
             (allocator_type *)&stack0xffffffffffffe70c);
  local_15c8.oneline_description._M_dataplus._M_p = (pointer)&local_15c8.oneline_description.field_2
  ;
  local_15c8.skip_type_check = true;
  local_15c8.oneline_description._M_string_length = 0;
  local_15c8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_15c8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_15c8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_15c8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_15c8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_15c8._58_8_ = 0;
  pRVar2 = &local_15c8;
  name_08._8_17_ = in_stack_ffffffffffffe6f0;
  name_08._M_dataplus._M_p = &pRVar2->skip_type_check;
  name_08.field_2._M_local_buf[9] = in_stack_ffffffffffffe701;
  name_08.field_2._10_2_ = in_stack_ffffffffffffe702;
  name_08.field_2._12_4_ = in_stack_ffffffffffffe704;
  opts_10.oneline_description.field_2._M_local_buf[0] = in_stack_ffffffffffffe7b8;
  opts_10.skip_type_check = (bool)in_stack_ffffffffffffe7a0[0];
  opts_10._1_7_ = in_stack_ffffffffffffe7a0._1_7_;
  opts_10.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a0._8_8_;
  opts_10.oneline_description._M_string_length = in_stack_ffffffffffffe7a0._16_8_;
  opts_10.oneline_description.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffe7b9;
  opts_10.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7c0._M_p;
  opts_10.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7c8;
  opts_10.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = in_stack_ffffffffffffe7d0;
  opts_10.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._9_15_ = in_stack_ffffffffffffe7d1;
  opts_10._64_8_ = in_stack_ffffffffffffe7e0;
  RPCArg::RPCArg(local_458 + 1,name_08,(Type)local_d40,(Fallback)in_stack_ffffffffffffe708,
                 in_stack_ffffffffffffe768,
                 (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_ffffffffffffe788,opts_10);
  std::__cxx11::string::string<std::allocator<char>>
            (local_15e8,"locktime",(allocator<char> *)&stack0xffffffffffffe70b);
  iVar4 = 0;
  UniValue::UniValue<int,_int,_true>(&local_16a0,(int *)&stack0xffffffffffffe704);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_1648,&local_16a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_16c0,"Raw locktime. Non-0 value also locktime-activates inputs",
             (allocator<char> *)&stack0xffffffffffffe703);
  local_1708.oneline_description._M_dataplus._M_p = (pointer)&local_1708.oneline_description.field_2
  ;
  local_1708.skip_type_check = false;
  local_1708.oneline_description._M_string_length = 0;
  local_1708.oneline_description.field_2._M_local_buf[0] = '\0';
  local_1708.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1708.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_1708.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_1708.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_1708._58_8_ = 0;
  name_09._8_17_ = in_stack_ffffffffffffe6f0;
  name_09._M_dataplus._M_p = &pRVar2->skip_type_check;
  name_09.field_2._M_local_buf[9] = in_stack_ffffffffffffe701;
  name_09.field_2._10_2_ = in_stack_ffffffffffffe702;
  name_09.field_2._12_4_ = iVar4;
  opts_04.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7a0._0_16_;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7a0._16_8_;
  opts_04._0_24_ = in_stack_ffffffffffffe788;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = in_stack_ffffffffffffe7b8;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = in_stack_ffffffffffffe7b9;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe7c0._M_p;
  opts_04.hidden = (bool)(char)in_stack_ffffffffffffe7c8;
  opts_04.also_positional = (bool)(char)(in_stack_ffffffffffffe7c8 >> 8);
  opts_04._66_6_ = (int6)(in_stack_ffffffffffffe7c8 >> 0x10);
  RPCArg::RPCArg(local_458 + 2,name_09,(Type)local_15e8,(Fallback)in_stack_ffffffffffffe708,
                 in_stack_ffffffffffffe768,opts_04);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1728,"replaceable",(allocator<char> *)&stack0xffffffffffffe702);
  bVar3 = true;
  UniValue::UniValue<bool,_bool,_true>(&local_17e0,(bool *)&stack0xffffffffffffe701);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_1788,&local_17e0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1800,
             "Marks this transaction as BIP125-replaceable.\nAllows this transaction to be replaced by a transaction with higher fees. If provided, it is an error if explicit sequence numbers are incompatible."
             ,(allocator<char> *)&stack0xffffffffffffe700);
  name_10._8_17_ = in_stack_ffffffffffffe6f0;
  name_10._M_dataplus._M_p = &pRVar2->skip_type_check;
  name_10.field_2._M_local_buf[9] = bVar3;
  name_10.field_2._10_2_ = in_stack_ffffffffffffe702;
  name_10.field_2._12_4_ = iVar4;
  opts_05.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7a0._0_16_;
  opts_05.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7a0._16_8_;
  opts_05._0_24_ = in_stack_ffffffffffffe788;
  opts_05.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  opts_05.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = in_stack_ffffffffffffe7b9;
  opts_05.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&stack0xffffffffffffe7d0;
  opts_05.hidden = false;
  opts_05.also_positional = false;
  opts_05._66_6_ = 0;
  RPCArg::RPCArg(local_458 + 3,name_10,(Type)local_1728,(Fallback)in_stack_ffffffffffffe708,
                 in_stack_ffffffffffffe768,opts_05);
  __l_04._M_len = 4;
  __l_04._M_array = local_458;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            (in_RDI,__l_04,(allocator_type *)&stack0xffffffffffffe6ff);
  lVar1 = 0x318;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_458[0].m_names._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x108;
  } while (lVar1 != -0x108);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)&stack0xffffffffffffe7b8);
  std::__cxx11::string::~string(local_1800);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_1788);
  UniValue::~UniValue(&local_17e0);
  std::__cxx11::string::~string(local_1728);
  RPCArgOptions::~RPCArgOptions(&local_1708);
  std::__cxx11::string::~string(local_16c0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_1648);
  UniValue::~UniValue(&local_16a0);
  std::__cxx11::string::~string(local_15e8);
  RPCArgOptions::~RPCArgOptions(&local_15c8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe750);
  lVar1 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_fd0[0].m_names._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x108;
  } while (lVar1 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_1580);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe710);
  RPCArg::~RPCArg(&local_1450);
  RPCArgOptions::~RPCArgOptions(&local_1538);
  std::__cxx11::string::~string(local_14f0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_14d0._M_first);
  std::__cxx11::string::~string(local_1470);
  std::__cxx11::string::~string(local_1348);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1328._M_first);
  std::__cxx11::string::~string(local_12c8);
  RPCArgOptions::~RPCArgOptions(&local_12a8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe730);
  RPCArg::~RPCArg(&local_1178);
  RPCArgOptions::~RPCArgOptions(&local_1260);
  std::__cxx11::string::~string((string *)&local_1218);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_11f8._M_first);
  std::__cxx11::string::~string(local_1198);
  std::__cxx11::string::~string(local_1070);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1050._M_first);
  std::__cxx11::string::~string(local_ff0);
  std::__cxx11::string::~string(local_dc0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_da0._M_first);
  std::__cxx11::string::~string(local_d40);
  RPCArgOptions::~RPCArgOptions(&local_d20);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe798);
  RPCArg::~RPCArg(&local_600);
  RPCArgOptions::~RPCArgOptions(&local_cd8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe778);
  lVar1 = 0x210;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_9b8[0].m_names._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x108;
  } while (lVar1 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_c90);
  std::__cxx11::string::~string(local_c48);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_c08);
  std::__cxx11::string::~string((string *)&local_c28);
  std::__cxx11::string::~string(local_ba8);
  RPCArgOptions::~RPCArgOptions(&local_b88);
  std::__cxx11::string::~string(local_b40);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_b20._M_first);
  std::__cxx11::string::~string(local_ac0);
  RPCArgOptions::~RPCArgOptions(&local_aa0);
  std::__cxx11::string::~string(local_a58);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_a38._M_first);
  std::__cxx11::string::~string(local_9d8);
  std::__cxx11::string::~string(local_6a0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_680._M_first);
  std::__cxx11::string::~string(local_620);
  std::__cxx11::string::~string(local_4f8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4d8._M_first);
  std::__cxx11::string::~string(local_478);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCArg> CreateTxDoc()
{
    return {
        {"inputs", RPCArg::Type::ARR, RPCArg::Optional::NO, "The inputs",
            {
                {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                    {
                        {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                        {"vout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The output number"},
                        {"sequence", RPCArg::Type::NUM, RPCArg::DefaultHint{"depends on the value of the 'replaceable' and 'locktime' arguments"}, "The sequence number"},
                    },
                },
            },
        },
        {"outputs", RPCArg::Type::ARR, RPCArg::Optional::NO, "The outputs specified as key-value pairs.\n"
                "Each key may only appear once, i.e. there can only be one 'data' output, and no address may be duplicated.\n"
                "At least one output of either type must be specified.\n"
                "For compatibility reasons, a dictionary, which holds the key-value pairs directly, is also\n"
                "                             accepted as second parameter.",
            {
                {"", RPCArg::Type::OBJ_USER_KEYS, RPCArg::Optional::OMITTED, "",
                    {
                        {"address", RPCArg::Type::AMOUNT, RPCArg::Optional::NO, "A key-value pair. The key (string) is the bitcoin address, the value (float or string) is the amount in " + CURRENCY_UNIT},
                    },
                },
                {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                    {
                        {"data", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "A key-value pair. The key must be \"data\", the value is hex-encoded data"},
                    },
                },
            },
         RPCArgOptions{.skip_type_check = true}},
        {"locktime", RPCArg::Type::NUM, RPCArg::Default{0}, "Raw locktime. Non-0 value also locktime-activates inputs"},
        {"replaceable", RPCArg::Type::BOOL, RPCArg::Default{true}, "Marks this transaction as BIP125-replaceable.\n"
                "Allows this transaction to be replaced by a transaction with higher fees. If provided, it is an error if explicit sequence numbers are incompatible."},
    };
}